

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceBase.hpp
# Opt level: O2

void __thiscall
Diligent::FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
          (FenceBase<Diligent::EngineVkImplTraits> *this,Uint64 Value)

{
  RenderDeviceVkImpl *pRVar1;
  Uint64 Value_local;
  __int_type_conflict3 EnqueuedValue;
  string msg;
  
  Value_local = Value;
  pRVar1 = DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>::
           GetDevice(&this->
                      super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                    );
  if (((pRVar1->
       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.NativeFence ==
       DEVICE_FEATURE_STATE_DISABLED) &&
     (EnqueuedValue = (this->m_EnqueuedFenceValue).super___atomic_base<unsigned_long>._M_i,
     EnqueuedValue < Value_local)) {
    FormatString<char[24],unsigned_long,char[59],unsigned_long,char[63]>
              (&msg,(Diligent *)"Can not wait for value ",(char (*) [24])&Value_local,
               (unsigned_long *)" that is greater than the last enqueued for signal value (",
               (char (*) [59])&EnqueuedValue,
               (unsigned_long *)"). This is not supported when NativeFence feature is disabled.",
               (char (*) [63])Value_local);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpDeviceWait",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FenceBase.hpp"
               ,99);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void DvpDeviceWait(Uint64 Value)
    {
#ifdef DILIGENT_DEVELOPMENT
        if (!this->GetDevice()->GetFeatures().NativeFence)
        {
            auto EnqueuedValue = m_EnqueuedFenceValue.load();
            DEV_CHECK_ERR(Value <= EnqueuedValue,
                          "Can not wait for value ", Value, " that is greater than the last enqueued for signal value (", EnqueuedValue,
                          "). This is not supported when NativeFence feature is disabled.");
        }
#endif
    }